

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono-test.cc
# Opt level: O0

void __thiscall ChronoTest_InvalidSpecs_Test::TestBody(ChronoTest_InvalidSpecs_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  format_error *e_18;
  bool gtest_caught_expected_18;
  string gtest_expected_message_18;
  AssertionResult gtest_ar_18;
  format_error *e_17;
  bool gtest_caught_expected_17;
  string gtest_expected_message_17;
  AssertionResult gtest_ar_17;
  format_error *e_16;
  bool gtest_caught_expected_16;
  string gtest_expected_message_16;
  AssertionResult gtest_ar_16;
  format_error *e_15;
  bool gtest_caught_expected_15;
  string gtest_expected_message_15;
  AssertionResult gtest_ar_15;
  format_error *e_14;
  bool gtest_caught_expected_14;
  string gtest_expected_message_14;
  AssertionResult gtest_ar_14;
  format_error *e_13;
  bool gtest_caught_expected_13;
  string gtest_expected_message_13;
  AssertionResult gtest_ar_13;
  format_error *e_12;
  bool gtest_caught_expected_12;
  string gtest_expected_message_12;
  AssertionResult gtest_ar_12;
  format_error *e_11;
  bool gtest_caught_expected_11;
  string gtest_expected_message_11;
  AssertionResult gtest_ar_11;
  format_error *e_10;
  bool gtest_caught_expected_10;
  string gtest_expected_message_10;
  AssertionResult gtest_ar_10;
  format_error *e_9;
  bool gtest_caught_expected_9;
  string gtest_expected_message_9;
  AssertionResult gtest_ar_9;
  format_error *e_8;
  bool gtest_caught_expected_8;
  string gtest_expected_message_8;
  AssertionResult gtest_ar_8;
  format_error *e_7;
  bool gtest_caught_expected_7;
  string gtest_expected_message_7;
  AssertionResult gtest_ar_7;
  format_error *e_6;
  bool gtest_caught_expected_6;
  string gtest_expected_message_6;
  AssertionResult gtest_ar_6;
  format_error *e_5;
  bool gtest_caught_expected_5;
  string gtest_expected_message_5;
  AssertionResult gtest_ar_5;
  format_error *e_4;
  bool gtest_caught_expected_4;
  string gtest_expected_message_4;
  AssertionResult gtest_ar_4;
  format_error *e_3;
  bool gtest_caught_expected_3;
  string gtest_expected_message_3;
  AssertionResult gtest_ar_3;
  format_error *e_2;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_2;
  format_error *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_1;
  format_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  seconds sec;
  AssertHelper *in_stack_fffffffffffff100;
  char *in_stack_fffffffffffff110;
  int in_stack_fffffffffffff11c;
  char *in_stack_fffffffffffff120;
  undefined4 in_stack_fffffffffffff128;
  Type in_stack_fffffffffffff12c;
  undefined7 in_stack_fffffffffffff130;
  undefined1 in_stack_fffffffffffff137;
  char (*in_stack_fffffffffffff138) [7];
  allocator *format_str;
  Message *in_stack_fffffffffffff178;
  undefined7 in_stack_fffffffffffff180;
  undefined1 in_stack_fffffffffffff187;
  string local_8f0 [38];
  byte local_8ca;
  allocator local_8c9;
  string local_8c8 [32];
  AssertionResult local_8a8 [3];
  string local_878 [38];
  byte local_852;
  allocator local_851;
  string local_850 [32];
  AssertionResult local_830 [3];
  string local_800 [38];
  byte local_7da;
  allocator local_7d9;
  string local_7d8 [32];
  AssertionResult local_7b8 [3];
  string local_788 [38];
  byte local_762;
  allocator local_761;
  string local_760 [32];
  AssertionResult local_740 [3];
  string local_710 [38];
  byte local_6ea;
  allocator local_6e9;
  string local_6e8 [32];
  AssertionResult local_6c8 [3];
  string local_698 [38];
  byte local_672;
  allocator local_671;
  string local_670 [32];
  AssertionResult local_650 [3];
  string local_620 [38];
  byte local_5fa;
  allocator local_5f9;
  string local_5f8 [32];
  AssertionResult local_5d8 [3];
  string local_5a8 [38];
  byte local_582;
  allocator local_581;
  string local_580 [32];
  AssertionResult local_560 [3];
  string local_530 [38];
  byte local_50a;
  allocator local_509;
  string local_508 [32];
  AssertionResult local_4e8 [3];
  string local_4b8 [38];
  byte local_492;
  allocator local_491;
  string local_490 [32];
  AssertionResult local_470 [3];
  string local_440 [38];
  byte local_41a;
  allocator local_419;
  string local_418 [32];
  AssertionResult local_3f8 [3];
  string local_3c8 [38];
  byte local_3a2;
  allocator local_3a1;
  string local_3a0 [32];
  AssertionResult local_380 [3];
  string local_350 [38];
  byte local_32a;
  allocator local_329;
  string local_328 [32];
  AssertionResult local_308 [3];
  string local_2d8 [38];
  byte local_2b2;
  allocator local_2b1;
  string local_2b0 [32];
  AssertionResult local_290 [3];
  string local_260 [38];
  byte local_23a;
  allocator local_239;
  string local_238 [32];
  AssertionResult local_218 [3];
  string local_1e8 [38];
  byte local_1c2;
  allocator local_1c1;
  string local_1c0 [32];
  AssertionResult local_1a0 [3];
  string local_170 [38];
  byte local_14a;
  allocator local_149;
  string local_148 [32];
  AssertionResult local_128 [3];
  string local_f8 [38];
  byte local_d2;
  allocator local_d1;
  string local_d0 [32];
  AssertionResult local_b0 [3];
  int local_7c;
  string local_78 [38];
  byte local_52;
  allocator local_51;
  string local_50 [48];
  AssertionResult local_20;
  undefined8 local_10;
  
  local_10 = 0;
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"no date",&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    local_52 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                ((char (*) [6])in_stack_fffffffffffff138,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_78);
    }
    if ((local_52 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [112])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 2;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_50);
    if (local_7c != 0) goto LAB_00111234;
  }
  else {
LAB_00111234:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
    testing::AssertionResult::failure_message((AssertionResult *)0x111250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
               in_stack_fffffffffffff110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
               in_stack_fffffffffffff178);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff100);
    testing::Message::~Message((Message *)0x1112b3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11130b);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"no date",&local_d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    local_d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                ((char (*) [6])in_stack_fffffffffffff138,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_f8);
    }
    if ((local_d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [112])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 3;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_d0);
    if (local_7c != 0) goto LAB_001116a6;
  }
  else {
LAB_001116a6:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
    testing::AssertionResult::failure_message((AssertionResult *)0x1116c2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
               in_stack_fffffffffffff110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
               in_stack_fffffffffffff178);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff100);
    testing::Message::~Message((Message *)0x111725);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11177d);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_128);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"no date",&local_149);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    local_14a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                ((char (*) [6])in_stack_fffffffffffff138,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_170);
    }
    if ((local_14a & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [112])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 4;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_148);
    if (local_7c != 0) goto LAB_00111b18;
  }
  else {
LAB_00111b18:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
    testing::AssertionResult::failure_message((AssertionResult *)0x111b34);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
               in_stack_fffffffffffff110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
               in_stack_fffffffffffff178);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff100);
    testing::Message::~Message((Message *)0x111b97);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x111bef);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1a0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c0,"no date",&local_1c1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    local_1c2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                ((char (*) [6])in_stack_fffffffffffff138,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_1e8);
    }
    if ((local_1c2 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [112])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 5;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_1c0);
    if (local_7c != 0) goto LAB_00111f8a;
  }
  else {
LAB_00111f8a:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
    testing::AssertionResult::failure_message((AssertionResult *)0x111fa6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
               in_stack_fffffffffffff110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
               in_stack_fffffffffffff178);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff100);
    testing::Message::~Message((Message *)0x112009);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x112061);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_218);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"no date",&local_239);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    local_23a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<1l,1l>>>
                (in_stack_fffffffffffff138,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_260);
    }
    if ((local_23a & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [113])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 6;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_238);
    if (local_7c != 0) goto LAB_001123fc;
  }
  else {
LAB_001123fc:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
    testing::AssertionResult::failure_message((AssertionResult *)0x112418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
               in_stack_fffffffffffff110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
               in_stack_fffffffffffff178);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff100);
    testing::Message::~Message((Message *)0x11247b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1124d3);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_290);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b0,"no date",&local_2b1);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    local_2b2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                ((char (*) [6])in_stack_fffffffffffff138,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_2d8);
    }
    if ((local_2b2 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [112])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 7;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_2b0);
    if (local_7c != 0) goto LAB_0011286e;
  }
  else {
LAB_0011286e:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
    testing::AssertionResult::failure_message((AssertionResult *)0x11288a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
               in_stack_fffffffffffff110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
               in_stack_fffffffffffff178);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff100);
    testing::Message::~Message((Message *)0x1128ed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x112945);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_308);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_328,"no date",&local_329);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
    local_32a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<1l,1l>>>
                (in_stack_fffffffffffff138,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_350);
    }
    if ((local_32a & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [113])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 8;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_328);
    if (local_7c != 0) goto LAB_00112ce0;
  }
  else {
LAB_00112ce0:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
    testing::AssertionResult::failure_message((AssertionResult *)0x112cfc);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
               in_stack_fffffffffffff110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
               in_stack_fffffffffffff178);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff100);
    testing::Message::~Message((Message *)0x112d5f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x112db7);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_380);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3a0,"no date",&local_3a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    local_3a2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                ((char (*) [6])in_stack_fffffffffffff138,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_3c8);
    }
    if ((local_3a2 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [112])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 9;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_3a0);
    if (local_7c != 0) goto LAB_00113152;
  }
  else {
LAB_00113152:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
    testing::AssertionResult::failure_message((AssertionResult *)0x11316e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
               in_stack_fffffffffffff110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
               in_stack_fffffffffffff178);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff100);
    testing::Message::~Message((Message *)0x1131d1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x113229);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3f8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_418,"no date",&local_419);
    std::allocator<char>::~allocator((allocator<char> *)&local_419);
    local_41a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                ((char (*) [6])in_stack_fffffffffffff138,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_440);
    }
    if ((local_41a & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [112])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 10;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_418);
    if (local_7c != 0) goto LAB_001135c4;
  }
  else {
LAB_001135c4:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
    testing::AssertionResult::failure_message((AssertionResult *)0x1135e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
               in_stack_fffffffffffff110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
               in_stack_fffffffffffff178);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff100);
    testing::Message::~Message((Message *)0x113643);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11369b);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_470);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_490,"no date",&local_491);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    local_492 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<1l,1l>>>
                (in_stack_fffffffffffff138,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_4b8);
    }
    if ((local_492 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [113])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 0xb;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_490);
    if (local_7c != 0) goto LAB_00113a36;
  }
  else {
LAB_00113a36:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
    testing::AssertionResult::failure_message((AssertionResult *)0x113a52);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
               in_stack_fffffffffffff110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
               in_stack_fffffffffffff178);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff100);
    testing::Message::~Message((Message *)0x113ab5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x113b0d);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4e8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_508,"no date",&local_509);
    std::allocator<char>::~allocator((allocator<char> *)&local_509);
    local_50a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                ((char (*) [6])in_stack_fffffffffffff138,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_530);
    }
    if ((local_50a & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [112])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 0xc;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_508);
    if (local_7c != 0) goto LAB_00113ea8;
  }
  else {
LAB_00113ea8:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
    testing::AssertionResult::failure_message((AssertionResult *)0x113ec4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
               in_stack_fffffffffffff110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
               in_stack_fffffffffffff178);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff100);
    testing::Message::~Message((Message *)0x113f27);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x113f7f);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_560);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_580,"no date",&local_581);
    std::allocator<char>::~allocator((allocator<char> *)&local_581);
    local_582 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                ((char (*) [6])in_stack_fffffffffffff138,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_5a8);
    }
    if ((local_582 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [112])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 0xd;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_580);
    if (local_7c != 0) goto LAB_0011431a;
  }
  else {
LAB_0011431a:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
    testing::AssertionResult::failure_message((AssertionResult *)0x114336);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
               in_stack_fffffffffffff110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
               in_stack_fffffffffffff178);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff100);
    testing::Message::~Message((Message *)0x114399);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1143f1);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5d8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5f8,"no date",&local_5f9);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
    local_5fa = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                ((char (*) [6])in_stack_fffffffffffff138,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_620);
    }
    if ((local_5fa & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [112])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 0xe;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_5f8);
    if (local_7c != 0) goto LAB_0011478c;
  }
  else {
LAB_0011478c:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
    testing::AssertionResult::failure_message((AssertionResult *)0x1147a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
               in_stack_fffffffffffff110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
               in_stack_fffffffffffff178);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff100);
    testing::Message::~Message((Message *)0x11480b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x114863);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_650);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_670,"no date",&local_671);
    std::allocator<char>::~allocator((allocator<char> *)&local_671);
    local_672 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                ((char (*) [6])in_stack_fffffffffffff138,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_698);
    }
    if ((local_672 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [112])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 0xf;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_670);
    if (local_7c != 0) goto LAB_00114bfe;
  }
  else {
LAB_00114bfe:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
    testing::AssertionResult::failure_message((AssertionResult *)0x114c1a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
               in_stack_fffffffffffff110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
               in_stack_fffffffffffff178);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff100);
    testing::Message::~Message((Message *)0x114c7d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x114cd5);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6c8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6e8,"no date",&local_6e9);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
    local_6ea = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                ((char (*) [6])in_stack_fffffffffffff138,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_710);
    }
    if ((local_6ea & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [112])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 0x10;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_6e8);
    if (local_7c != 0) goto LAB_00115070;
  }
  else {
LAB_00115070:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
    testing::AssertionResult::failure_message((AssertionResult *)0x11508c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
               in_stack_fffffffffffff110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
               in_stack_fffffffffffff178);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff100);
    testing::Message::~Message((Message *)0x1150ef);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x115147);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_740);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_760,"no date",&local_761);
    std::allocator<char>::~allocator((allocator<char> *)&local_761);
    local_762 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                ((char (*) [6])in_stack_fffffffffffff138,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_788);
    }
    if ((local_762 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [112])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 0x11;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_760);
    if (local_7c != 0) goto LAB_001154e2;
  }
  else {
LAB_001154e2:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
    testing::AssertionResult::failure_message((AssertionResult *)0x1154fe);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
               in_stack_fffffffffffff110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
               in_stack_fffffffffffff178);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff100);
    testing::Message::~Message((Message *)0x115561);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1155b9);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7b8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7d8,"invalid format",&local_7d9);
    std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
    local_7da = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                ((char (*) [6])in_stack_fffffffffffff138,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_800);
    }
    if ((local_7da & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [112])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 0x12;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_7d8);
    if (local_7c != 0) goto LAB_00115954;
  }
  else {
LAB_00115954:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
    testing::AssertionResult::failure_message((AssertionResult *)0x115970);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
               in_stack_fffffffffffff110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
               in_stack_fffffffffffff178);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff100);
    testing::Message::~Message((Message *)0x1159d3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x115a2b);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_830);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_850,"invalid format",&local_851);
    std::allocator<char>::~allocator((allocator<char> *)&local_851);
    local_852 = 0;
    in_stack_fffffffffffff187 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff187) {
      fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<1l,1l>>>
                (in_stack_fffffffffffff138,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_878);
    }
    if ((local_852 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [113])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 0x13;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_850);
    if (local_7c != 0) goto LAB_00115dae;
  }
  else {
LAB_00115dae:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
    testing::AssertionResult::failure_message((AssertionResult *)0x115dca);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
               in_stack_fffffffffffff110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
               in_stack_fffffffffffff178);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff100);
    testing::Message::~Message((Message *)0x115e27);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x115e7f);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8a8);
  if (bVar1) {
    format_str = &local_8c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8c8,"invalid format",format_str);
    std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
    local_8ca = 0;
    in_stack_fffffffffffff137 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff137) {
      fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<1l,1l>>>
                ((char (*) [7])format_str,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
      std::__cxx11::string::~string(local_8f0);
    }
    if ((local_8ca & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (char (*) [113])CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
      local_7c = 0x14;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_8c8);
    if (local_7c == 0) goto LAB_0011629f;
  }
  testing::Message::Message
            ((Message *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130));
  this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1161fa);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
             in_stack_fffffffffffff12c,in_stack_fffffffffffff120,in_stack_fffffffffffff11c,
             in_stack_fffffffffffff110);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffff187,in_stack_fffffffffffff180),
             in_stack_fffffffffffff178);
  testing::internal::AssertHelper::~AssertHelper(this_00);
  testing::Message::~Message((Message *)0x116257);
LAB_0011629f:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1162ac);
  return;
}

Assistant:

TEST(ChronoTest, InvalidSpecs) {
  auto sec = std::chrono::seconds(0);
  EXPECT_THROW_MSG(fmt::format("{:%a}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%A}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%c}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%x}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%Ex}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%X}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%EX}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%D}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%F}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%Ec}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%w}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%u}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%b}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%B}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%z}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%Z}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%q}", sec), fmt::format_error,
                   "invalid format");
  EXPECT_THROW_MSG(fmt::format("{:%Eq}", sec), fmt::format_error,
                   "invalid format");
  EXPECT_THROW_MSG(fmt::format("{:%Oq}", sec), fmt::format_error,
                   "invalid format");
}